

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CGL::GLScene::Mesh::flip_selected_edge(Mesh *this)

{
  flip_selected_edge((Mesh *)&this[-1].bsdf);
  return;
}

Assistant:

void Mesh::flip_selected_edge() {
  HalfedgeElement *element = selectedFeature.element;
  if (element == nullptr) return;
  Edge *edge = element->getEdge();
  if (edge == nullptr) return;
  mesh.flipEdge(edge->halfedge()->edge());
  invalidate_selection();
}